

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_writer.cpp
# Opt level: O0

void embree::SceneGraph::storeXML
               (Ref<embree::SceneGraph::Node> *root,FileName *fileName,bool embedTextures,
               bool referenceMaterials,bool binaryFormat)

{
  long *plVar1;
  long *in_RDI;
  XMLWriter *in_stack_fffffffffffffb00;
  undefined1 in_stack_fffffffffffffcad;
  undefined1 in_stack_fffffffffffffcae;
  undefined1 in_stack_fffffffffffffcaf;
  FileName *in_stack_fffffffffffffcb0;
  Ref<embree::SceneGraph::Node> *in_stack_fffffffffffffcb8;
  XMLWriter *in_stack_fffffffffffffcc0;
  
  plVar1 = (long *)*in_RDI;
  if (plVar1 != (long *)0x0) {
    (**(code **)(*plVar1 + 0x10))();
  }
  XMLWriter::XMLWriter
            (in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0,
             (bool)in_stack_fffffffffffffcaf,(bool)in_stack_fffffffffffffcae,
             (bool)in_stack_fffffffffffffcad);
  XMLWriter::~XMLWriter(in_stack_fffffffffffffb00);
  if (plVar1 != (long *)0x0) {
    (**(code **)(*plVar1 + 0x18))();
  }
  return;
}

Assistant:

void SceneGraph::storeXML(Ref<SceneGraph::Node> root, const FileName& fileName, bool embedTextures, bool referenceMaterials, bool binaryFormat) {
    XMLWriter(root,fileName,embedTextures,referenceMaterials,binaryFormat);
  }